

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O2

int __thiscall deqp::egl::BufferAgeTests::init(BufferAgeTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  EglTestContext *eglTestCtx;
  pointer pvVar2;
  _Alloc_hider str;
  deUint32 dVar3;
  int extraout_EAX;
  TestCaseGroup *this_00;
  _anonymous_namespace_ *this_01;
  TestCase *this_02;
  allocator_type *in_RCX;
  long lVar4;
  char *name_00;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *extraout_RDX;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *drawTypes;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *drawTypes_00;
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  *extraout_RDX_00;
  ulong uVar5;
  _anonymous_namespace_ *this_03;
  ulong uVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  TestNode *local_138;
  TestCaseGroup *local_130;
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  frameDrawTypes;
  _anonymous_namespace_ *local_f8;
  DrawType renderClear [2];
  DrawType clearRender [2];
  ulong local_d0;
  long local_c8;
  ulong local_c0;
  ulong local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string name;
  string local_50;
  
  clearRender[0] = DRAWTYPE_GLES2_CLEAR;
  clearRender[1] = DRAWTYPE_GLES2_RENDER;
  renderClear[0] = DRAWTYPE_GLES2_RENDER;
  renderClear[1] = DRAWTYPE_GLES2_CLEAR;
  frameDrawTypes.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  frameDrawTypes.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  frameDrawTypes.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._M_dataplus._M_p = (char *)0x0;
  local_158._M_string_length = 0;
  local_158.field_2._M_allocated_capacity = 0;
  local_138 = (TestNode *)this;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&local_158);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                   *)&local_158);
  local_90._M_dataplus._M_p._0_4_ = 0;
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
            *)&local_158,1,(value_type *)&local_90,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&local_158);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                   *)&local_158);
  local_90._M_dataplus._M_p._0_4_ = 1;
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
            *)&local_158,1,(value_type *)&local_90,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&local_158);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                   *)&local_158);
  local_90._M_dataplus._M_p._0_4_ = 0;
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
            *)&local_158,2,(value_type *)&local_90,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&local_158);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                   *)&local_158);
  local_90._M_dataplus._M_p._0_4_ = 1;
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
            *)&local_158,2,(value_type *)&local_90,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&local_158);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                   *)&local_158);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
              *)&local_158,clearRender,(DrawType *)&local_d0,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&local_158);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                   *)&local_158);
  std::
  vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>>
              *)&local_158,renderClear,clearRender,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&local_158);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                   *)&local_158);
  pvVar2 = frameDrawTypes.
           super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c0 = ((long)frameDrawTypes.
                    super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)frameDrawTypes.
                   super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  uVar6 = 0;
  while ((int)uVar6 != 2) {
    this_00 = (TestCaseGroup *)operator_new(0x78);
    name_00 = "no_preserve";
    if ((int)uVar6 == 0) {
      name_00 = "preserve";
    }
    TestCaseGroup::TestCaseGroup(this_00,(EglTestContext *)local_138[1]._vptr_TestNode,name_00,"");
    lVar4 = 0;
    local_d0 = uVar6;
    while (uVar7 = local_d0, lVar4 != 3) {
      iVar1 = (&DAT_00330ddc)[lVar4];
      local_c8 = lVar4;
      local_130 = (TestCaseGroup *)operator_new(0x78);
      eglTestCtx = (EglTestContext *)local_138[1]._vptr_TestNode;
      if (iVar1 == 2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"resize_after_swap",(allocator<char> *)&local_90);
      }
      else if (iVar1 == 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"resize_before_swap",(allocator<char> *)&local_90);
      }
      else if (iVar1 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"no_resize",(allocator<char> *)&local_90);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"",(allocator<char> *)&local_90);
      }
      TestCaseGroup::TestCaseGroup(local_130,eglTestCtx,local_158._M_dataplus._M_p,"");
      std::__cxx11::string::~string((string *)&local_158);
      local_f8 = (_anonymous_namespace_ *)pvVar2;
      uVar7 = 0;
      drawTypes = extraout_RDX;
      while( true ) {
        uVar5 = uVar7;
        if (uVar7 < local_c0) {
          uVar5 = local_c0;
        }
        if (local_c0 == uVar7) break;
        this_01 = (_anonymous_namespace_ *)(pvVar2 + uVar7);
        this_03 = local_f8;
        local_b8 = uVar7;
        while( true ) {
          if (local_b8 == uVar5) break;
          (anonymous_namespace)::generateDrawTypeName_abi_cxx11_(&local_b0,this_03,drawTypes);
          std::operator+(&local_90,"odd",&local_b0);
          std::operator+(&local_158,&local_90,"_even");
          (anonymous_namespace)::generateDrawTypeName_abi_cxx11_(&local_50,this_01,drawTypes_00);
          std::operator+(&name,&local_158,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          this_02 = (TestCase *)operator_new(0x1b18);
          str = name._M_dataplus;
          TestCase::TestCase(this_02,(EglTestContext *)local_138[1]._vptr_TestNode,
                             name._M_dataplus._M_p,"");
          (this_02->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__BufferAgeTest_003d9250;
          dVar3 = deStringHash(str._M_p);
          *(deUint32 *)&this_02[1].super_TestCase.super_TestNode._vptr_TestNode = dVar3;
          *(byte *)((long)&this_02[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
               (byte)uVar6 ^ 1;
          std::
          vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          ::vector((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    *)&this_02[1].super_TestCase.super_TestNode.m_testCtx,
                   (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    *)this_03);
          std::
          vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          ::vector((vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    *)&this_02[1].super_TestCase.super_TestNode.m_name.field_2,
                   (vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                    *)this_01);
          *(undefined4 *)&this_02[1].super_TestCase.super_TestNode.m_description._M_string_length =
               0;
          this_02[1].super_TestCase.super_TestNode.m_children.
          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          this_02[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&this_02[1].super_TestCase.super_TestNode.m_description.field_2 + 8)
               = 0;
          *(undefined8 *)&this_02[1].super_TestCase.super_TestNode.m_nodeType = 0;
          glw::Functions::Functions
                    ((Functions *)
                     &this_02[1].super_TestCase.super_TestNode.m_children.
                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          *(undefined8 *)&this_02[0x39].super_TestCase.super_TestNode.m_nodeType = 0;
          this_02[0x39].super_TestCase.super_TestNode.m_children.
          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          tcu::TestNode::addChild((TestNode *)local_130,(TestNode *)this_02);
          std::__cxx11::string::~string((string *)&name);
          uVar5 = uVar5 - 1;
          this_03 = this_03 + 0x18;
          drawTypes = extraout_RDX_00;
        }
        uVar7 = local_b8 + 1;
        local_f8 = local_f8 + 0x18;
      }
      tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)local_130);
      lVar4 = local_c8 + 1;
    }
    tcu::TestNode::addChild(local_138,(TestNode *)this_00);
    uVar6 = (ulong)((int)uVar7 + 1);
  }
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>_>_>
  ::~vector(&frameDrawTypes);
  return extraout_EAX;
}

Assistant:

void BufferAgeTests::init (void)
{
	const BufferAgeTest::DrawType clearRender[] =
	{
		BufferAgeTest::DRAWTYPE_GLES2_CLEAR,
		BufferAgeTest::DRAWTYPE_GLES2_RENDER
	};

	const BufferAgeTest::DrawType renderClear[] =
	{
		BufferAgeTest::DRAWTYPE_GLES2_RENDER,
		BufferAgeTest::DRAWTYPE_GLES2_CLEAR
	};

	const BufferAgeTest::ResizeType resizeTypes[] =
	{
		BufferAgeTest::RESIZETYPE_NONE,
		BufferAgeTest::RESIZETYPE_BEFORE_SWAP,
		BufferAgeTest::RESIZETYPE_AFTER_SWAP
	};

	vector< vector<BufferAgeTest::DrawType> > frameDrawTypes;
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> ());
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (1, BufferAgeTest::DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (1, BufferAgeTest::DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (2, BufferAgeTest::DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (2, BufferAgeTest::DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (DE_ARRAY_BEGIN(clearRender), DE_ARRAY_END(clearRender)));
	frameDrawTypes.push_back(vector<BufferAgeTest::DrawType> (DE_ARRAY_BEGIN(renderClear), DE_ARRAY_END(renderClear)));

	for (int preserveNdx = 0; preserveNdx < 2; preserveNdx++)
	{
		const bool				preserve		= (preserveNdx == 0);
		TestCaseGroup* const	preserveGroup	= new TestCaseGroup(m_eglTestCtx, (preserve ? "preserve" : "no_preserve"), "");

		for (size_t resizeTypeNdx = 0; resizeTypeNdx < DE_LENGTH_OF_ARRAY(resizeTypes); resizeTypeNdx++)
		{
			const BufferAgeTest::ResizeType	resizeType	= resizeTypes[resizeTypeNdx];
			TestCaseGroup* const			resizeGroup	= new TestCaseGroup(m_eglTestCtx, generateResizeGroupName(resizeType).c_str(), "");

			for (size_t evenNdx = 0; evenNdx < frameDrawTypes.size(); evenNdx++)
			{
				const vector<BufferAgeTest::DrawType>& evenFrameDrawType = frameDrawTypes[evenNdx];

				for (size_t oddNdx = evenNdx; oddNdx < frameDrawTypes.size(); oddNdx++)
				{
					const vector<BufferAgeTest::DrawType>&	oddFrameDrawType	= frameDrawTypes[oddNdx];
					const std::string						name				= generateTestName(oddFrameDrawType, evenFrameDrawType);
					resizeGroup->addChild(new BufferAgeTest(m_eglTestCtx, preserve, oddFrameDrawType, evenFrameDrawType, BufferAgeTest::RESIZETYPE_NONE, name.c_str(), ""));
				}
			}

			preserveGroup->addChild(resizeGroup);
		}
		addChild(preserveGroup);
	}
}